

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O1

void __thiscall
NewFunctionProcessingVisitor::Visit(NewFunctionProcessingVisitor *this,Formals *formals)

{
  pointer pcVar1;
  uint uVar2;
  pointer ppVar3;
  string local_b8;
  string local_98;
  pointer local_78;
  Symbol local_70;
  Symbol local_50;
  
  uVar2 = FrameEmulator::GetFieldSize(&this->frame_);
  ppVar3 = (formals->formals_).
           super__Vector_base<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_78 = (formals->formals_).
             super__Vector_base<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar3 != local_78) {
    uVar2 = ~uVar2;
    do {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      pcVar1 = (ppVar3->second)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,pcVar1,pcVar1 + (ppVar3->second)._M_string_length);
      Symbol::Symbol(&local_50,&local_98);
      FunctionTable::CreateVariable(&this->table_,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50.name_._M_dataplus._M_p != &local_50.name_.field_2) {
        operator_delete(local_50.name_._M_dataplus._M_p,
                        local_50.name_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      pcVar1 = (ppVar3->second)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,pcVar1,pcVar1 + (ppVar3->second)._M_string_length);
      Symbol::Symbol(&local_70,&local_b8);
      FunctionTable::Put(&this->table_,&local_70,uVar2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.name_._M_dataplus._M_p != &local_70.name_.field_2) {
        operator_delete(local_70.name_._M_dataplus._M_p,
                        local_70.name_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      uVar2 = uVar2 - 1;
      ppVar3 = ppVar3 + 1;
    } while (ppVar3 != local_78);
  }
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(Formals* formals) {
  int index = -frame_.GetFieldSize() - 1;

  for (auto&& formal : formals->formals_) {
    table_.CreateVariable(Symbol(formal.second));
    table_.Put(Symbol(formal.second), index);
    --index;
  }
}